

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void uv__queue_done(uv__work *w,int err)

{
  uv_work_t *req;
  int err_local;
  uv__work *w_local;
  
  if (*(int *)(w[-2].work + 0x20) == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/threadpool.c"
                  ,0x152,"void uv__queue_done(struct uv__work *, int)");
  }
  *(int *)(w[-2].work + 0x20) = *(int *)(w[-2].work + 0x20) + -1;
  if (w[-1].wq.prev != (uv__queue *)0x0) {
    (*(code *)w[-1].wq.prev)(&w[-3].wq.prev,err);
  }
  return;
}

Assistant:

static void uv__queue_done(struct uv__work* w, int err) {
  uv_work_t* req;

  req = container_of(w, uv_work_t, work_req);
  uv__req_unregister(req->loop, req);

  if (req->after_work_cb == NULL)
    return;

  req->after_work_cb(req, err);
}